

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void __thiscall
std::_Tuple_impl<2ul,testing::Matcher<unsigned_char>,testing::Matcher<unsigned_char>>::
_Tuple_impl<testing::Matcher<unsigned_char>,testing::Matcher<unsigned_char>,void>
          (_Tuple_impl<2UL,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_char>_> *this
          ,Matcher<unsigned_char> *__head,Matcher<unsigned_char> *__tail)

{
  (this->super__Tuple_impl<3UL,_testing::Matcher<unsigned_char>_>).
  super__Head_base<3UL,_testing::Matcher<unsigned_char>,_false>._M_head_impl.
  super_MatcherBase<unsigned_char>.vtable_ = (__tail->super_MatcherBase<unsigned_char>).vtable_;
  (this->super__Tuple_impl<3UL,_testing::Matcher<unsigned_char>_>).
  super__Head_base<3UL,_testing::Matcher<unsigned_char>,_false>._M_head_impl.
  super_MatcherBase<unsigned_char>.buffer_ = (__tail->super_MatcherBase<unsigned_char>).buffer_;
  (__tail->super_MatcherBase<unsigned_char>).vtable_ = (VTable *)0x0;
  (this->super__Tuple_impl<3UL,_testing::Matcher<unsigned_char>_>).
  super__Head_base<3UL,_testing::Matcher<unsigned_char>,_false>._M_head_impl.
  super_MatcherBase<unsigned_char>.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_002f5c40;
  (this->super__Head_base<2UL,_testing::Matcher<unsigned_char>,_false>)._M_head_impl.
  super_MatcherBase<unsigned_char>.vtable_ = (__head->super_MatcherBase<unsigned_char>).vtable_;
  (this->super__Head_base<2UL,_testing::Matcher<unsigned_char>,_false>)._M_head_impl.
  super_MatcherBase<unsigned_char>.buffer_ = (__head->super_MatcherBase<unsigned_char>).buffer_;
  (__head->super_MatcherBase<unsigned_char>).vtable_ = (VTable *)0x0;
  (this->super__Head_base<2UL,_testing::Matcher<unsigned_char>,_false>)._M_head_impl.
  super_MatcherBase<unsigned_char>.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_002f5c40;
  return;
}

Assistant:

MatcherBase(MatcherBase&& other)
      : vtable_(other.vtable_), buffer_(other.buffer_) {
    other.vtable_ = nullptr;
  }